

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

const_pointer __thiscall
absl::
InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>
::data(InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>
       *this)

{
  bool bVar1;
  undefined8 local_30;
  InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>
  *this_local;
  
  bVar1 = allocated(this);
  if (bVar1) {
    local_30 = allocated_space(this);
  }
  else {
    local_30 = inlined_space(this);
  }
  return local_30;
}

Assistant:

const_pointer data() const noexcept {
    return allocated() ? allocated_space() : inlined_space();
  }